

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.cpp
# Opt level: O2

ostream * L14_2::operator<<(ostream *os,Student *stu)

{
  std::operator<<(os,"Scores for ");
}

Assistant:

std::ostream& operator<<(std::ostream &os, const Student &stu) {
        os << "Scores for " << (std::string &)stu << ":\n";
        stu.output(os);
        return os;
    }